

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O0

void KINFreeVectors(KINMem kin_mem)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x110) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x110));
    *(undefined8 *)(in_RDI + 0x110) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x118) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x118));
    *(undefined8 *)(in_RDI + 0x118) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x138) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x138));
    *(undefined8 *)(in_RDI + 0x138) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x148) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x148));
    *(undefined8 *)(in_RDI + 0x148) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x150) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x150));
    *(undefined8 *)(in_RDI + 0x150) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x158) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x158));
    *(undefined8 *)(in_RDI + 0x158) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x120) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x120));
    *(undefined8 *)(in_RDI + 0x120) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x1a8) != 0) {
    free(*(void **)(in_RDI + 0x1a8));
    *(undefined8 *)(in_RDI + 0x1a8) = 0;
  }
  if (*(long *)(in_RDI + 0x1a0) != 0) {
    free(*(void **)(in_RDI + 0x1a0));
    *(undefined8 *)(in_RDI + 0x1a0) = 0;
  }
  if (*(long *)(in_RDI + 0x200) != 0) {
    free(*(void **)(in_RDI + 0x200));
    *(undefined8 *)(in_RDI + 0x200) = 0;
  }
  if (*(long *)(in_RDI + 0x208) != 0) {
    free(*(void **)(in_RDI + 0x208));
    *(undefined8 *)(in_RDI + 0x208) = 0;
  }
  if (*(long *)(in_RDI + 0x170) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x170));
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x178) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x178));
    *(undefined8 *)(in_RDI + 0x178) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x180) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x180),*(ulong *)(in_RDI + 0x1b8) & 0xffffffff);
    *(undefined8 *)(in_RDI + 0x180) = 0;
    *(long *)(in_RDI + 0x220) =
         *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) =
         *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x188) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 0x188),*(ulong *)(in_RDI + 0x1b8) & 0xffffffff);
    *(undefined8 *)(in_RDI + 0x188) = 0;
    *(long *)(in_RDI + 0x220) =
         *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) =
         *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 400) != 0) {
    N_VDestroyVectorArray(*(undefined8 *)(in_RDI + 400),*(ulong *)(in_RDI + 0x1b8) & 0xffffffff);
    *(undefined8 *)(in_RDI + 400) = 0;
    *(long *)(in_RDI + 0x220) =
         *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) =
         *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x1b8) * *(long *)(in_RDI + 0x218);
  }
  if (*(long *)(in_RDI + 0x1f0) != 0) {
    free(*(void **)(in_RDI + 0x1f0));
    *(undefined8 *)(in_RDI + 0x1f0) = 0;
  }
  if (*(long *)(in_RDI + 0x1b0) != 0) {
    free(*(void **)(in_RDI + 0x1b0));
    *(undefined8 *)(in_RDI + 0x1b0) = 0;
  }
  if (*(long *)(in_RDI + 0x140) != 0) {
    N_VDestroy(*(undefined8 *)(in_RDI + 0x140));
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(long *)(in_RDI + 0x220) = *(long *)(in_RDI + 0x220) - *(long *)(in_RDI + 0x210);
    *(long *)(in_RDI + 0x228) = *(long *)(in_RDI + 0x228) - *(long *)(in_RDI + 0x218);
  }
  return;
}

Assistant:

static void KINFreeVectors(KINMem kin_mem)
{
  if (kin_mem->kin_unew != NULL)
  {
    N_VDestroy(kin_mem->kin_unew);
    kin_mem->kin_unew = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_fval != NULL)
  {
    N_VDestroy(kin_mem->kin_fval);
    kin_mem->kin_fval = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_pp != NULL)
  {
    N_VDestroy(kin_mem->kin_pp);
    kin_mem->kin_pp = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_vtemp1 != NULL)
  {
    N_VDestroy(kin_mem->kin_vtemp1);
    kin_mem->kin_vtemp1 = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_vtemp2 != NULL)
  {
    N_VDestroy(kin_mem->kin_vtemp2);
    kin_mem->kin_vtemp2 = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_vtemp3 != NULL)
  {
    N_VDestroy(kin_mem->kin_vtemp3);
    kin_mem->kin_vtemp3 = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_gval != NULL)
  {
    N_VDestroy(kin_mem->kin_gval);
    kin_mem->kin_gval = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_R_aa != NULL)
  {
    free(kin_mem->kin_R_aa);
    kin_mem->kin_R_aa = NULL;
  }

  if (kin_mem->kin_gamma_aa != NULL)
  {
    free(kin_mem->kin_gamma_aa);
    kin_mem->kin_gamma_aa = NULL;
  }

  if (kin_mem->kin_cv != NULL)
  {
    free(kin_mem->kin_cv);
    kin_mem->kin_cv = NULL;
  }

  if (kin_mem->kin_Xv != NULL)
  {
    free(kin_mem->kin_Xv);
    kin_mem->kin_Xv = NULL;
  }

  if (kin_mem->kin_fold_aa != NULL)
  {
    N_VDestroy(kin_mem->kin_fold_aa);
    kin_mem->kin_fold_aa = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_gold_aa != NULL)
  {
    N_VDestroy(kin_mem->kin_gold_aa);
    kin_mem->kin_gold_aa = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  if (kin_mem->kin_df_aa != NULL)
  {
    N_VDestroyVectorArray(kin_mem->kin_df_aa, (int)kin_mem->kin_m_aa);
    kin_mem->kin_df_aa = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_m_aa * kin_mem->kin_liw1;
  }

  if (kin_mem->kin_dg_aa != NULL)
  {
    N_VDestroyVectorArray(kin_mem->kin_dg_aa, (int)kin_mem->kin_m_aa);
    kin_mem->kin_dg_aa = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_m_aa * kin_mem->kin_liw1;
  }

  if (kin_mem->kin_q_aa != NULL)
  {
    N_VDestroyVectorArray(kin_mem->kin_q_aa, (int)kin_mem->kin_m_aa);
    kin_mem->kin_q_aa = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_m_aa * kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_m_aa * kin_mem->kin_liw1;
  }

  if (kin_mem->kin_qr_data != NULL)
  {
    free(kin_mem->kin_qr_data);
    kin_mem->kin_qr_data = NULL;
  }

  if (kin_mem->kin_T_aa != NULL)
  {
    free(kin_mem->kin_T_aa);
    kin_mem->kin_T_aa = NULL;
  }

  if (kin_mem->kin_constraints != NULL)
  {
    N_VDestroy(kin_mem->kin_constraints);
    kin_mem->kin_constraints = NULL;
    kin_mem->kin_lrw -= kin_mem->kin_lrw1;
    kin_mem->kin_liw -= kin_mem->kin_liw1;
  }

  return;
}